

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parallel_for_each.cpp
# Opt level: O2

void __thiscall ParallelForEach_OneElement_Test::TestBody(ParallelForEach_OneElement_Test *this)

{
  vector<int,_std::allocator<int>_> *rhs;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<int,_std::allocator<int>_>_>_>
  *matcher;
  char *message;
  AssertHelper AStack_98;
  _Vector_base<int,_std::allocator<int>_> local_90;
  AssertionResult gtest_ar;
  _Vector_base<int,_std::allocator<int>_> local_68;
  container out;
  container expected;
  container src;
  
  anon_unknown.dwarf_e5698::ParallelForEach::make_input(&src,1);
  anon_unknown.dwarf_e5698::ParallelForEach::make_expected(&expected,1);
  anon_unknown.dwarf_e5698::ParallelForEach::run_for_each(&out,&src);
  testing::ContainerEq<std::vector<int,std::allocator<int>>>
            ((PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<int,_std::allocator<int>_>_>_>
              *)&local_68,(testing *)&expected,rhs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<int,std::allocator<int>>>>>
            ((PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<int,_std::allocator<int>_>_>_>_>
              *)&local_90,(internal *)&local_68,matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<int,std::allocator<int>>>>>
  ::operator()(&gtest_ar,(char *)&local_90,(vector<int,_std::allocator<int>_> *)0x1c798c);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_90);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_90);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = anon_var_dwarf_73ef0 + 0x50;
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_parallel_for_each.cpp"
               ,0x57,message);
    testing::internal::AssertHelper::operator=(&AStack_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&AStack_98);
    if ((long *)local_90._M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
      (**(code **)(*(long *)local_90._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&out);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&expected);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&src);
  return;
}

Assistant:

TEST_F (ParallelForEach, OneElement) {
    auto const src = make_input (1U);
    auto const expected = make_expected (1U);
    auto const out = run_for_each (src);
    EXPECT_THAT (out, ::testing::ContainerEq (expected));
}